

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateMapGetters
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  FieldDescriptor *pFVar1;
  bool bVar2;
  JavaType JVar3;
  FieldDescriptor *pFVar4;
  char *pcVar5;
  size_t sVar6;
  Context *pCVar7;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view begin_varname_01;
  string_view begin_varname_02;
  string_view begin_varname_03;
  string_view begin_varname_04;
  string_view begin_varname_05;
  string_view begin_varname_06;
  string_view begin_varname_07;
  string_view begin_varname_08;
  string_view begin_varname_09;
  string_view begin_varname_10;
  string_view begin_varname_11;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  string_view end_varname_04;
  string_view end_varname_05;
  string_view end_varname_06;
  string_view end_varname_07;
  string_view end_varname_08;
  string_view end_varname_09;
  string_view end_varname_10;
  string_view end_varname_11;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  Options local_350;
  Options local_300;
  Options local_2b0;
  Options local_260;
  Options local_210;
  Options local_1c0;
  Options local_170;
  Options local_120;
  Options local_d0;
  Options local_80;
  
  vars = &this->variables_;
  text._M_str = 
  "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return internalGet$capitalized_name$().getMap().size();\n}\n"
  ;
  text._M_len = 0x79;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text);
  begin_varname._M_str = "{";
  begin_varname._M_len = 1;
  end_varname._M_str = "}";
  end_varname._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname,end_varname,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar4 = this->descriptor_;
  Options::Options(&local_80,&this->context_->options_);
  WriteFieldDocComment(printer,pFVar4,&local_80,false);
  Options::~Options(&local_80);
  text_00._M_str =
       "@java.lang.Override\n$deprecation$public boolean ${$contains$capitalized_name$$}$(\n    $key_type$ key) {\n  $key_null_check$\n  return internalGet$capitalized_name$().getMap().containsKey(key);\n}\n"
  ;
  text_00._M_len = 0xc1;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_00);
  begin_varname_00._M_str = "{";
  begin_varname_00._M_len = 1;
  end_varname_00._M_str = "}";
  end_varname_00._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_00,end_varname_00,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar4 = MapValueField(this->descriptor_);
  JVar3 = GetJavaType(pFVar4);
  pCVar7 = this->context_;
  bVar2 = (pCVar7->options_).opensource_runtime;
  if (JVar3 == JAVATYPE_ENUM) {
    if (bVar2 != false) {
      text_01._M_str =
           "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Override\n@java.lang.Deprecated\npublic java.util.Map<$boxed_key_type$, $value_enum_type$>\n${$get$capitalized_name$$}$() {\n  return get$capitalized_name$Map();\n}\n"
      ;
      text_01._M_len = 0xe7;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,vars,text_01);
      begin_varname_01._M_str = "{";
      begin_varname_01._M_len = 1;
      end_varname_01._M_str = "}";
      end_varname_01._M_len = 1;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,begin_varname_01,end_varname_01,this->descriptor_,
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
      pCVar7 = this->context_;
    }
    pFVar1 = this->descriptor_;
    Options::Options(&local_d0,&pCVar7->options_);
    WriteFieldDocComment(printer,pFVar1,&local_d0,false);
    Options::~Options(&local_d0);
    text_02._M_str =
         "@java.lang.Override\n$deprecation$public java.util.Map<$boxed_key_type$, $value_enum_type$>\n${$get$capitalized_name$Map$}$() {\n  return internalGetAdapted$capitalized_name$Map(\n      internalGet$capitalized_name$().getMap());}\n"
    ;
    text_02._M_len = 0xe2;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_02);
    begin_varname_02._M_str = "{";
    begin_varname_02._M_len = 1;
    end_varname_02._M_str = "}";
    end_varname_02._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_02,end_varname_02,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar1 = this->descriptor_;
    Options::Options(&local_120,&this->context_->options_);
    WriteFieldDocComment(printer,pFVar1,&local_120,false);
    Options::~Options(&local_120);
    text_03._M_str =
         "@java.lang.Override\n$deprecation$public $value_enum_type_pass_through_nullness$ ${$get$capitalized_name$OrDefault$}$(\n    $key_type$ key,\n    $value_enum_type_pass_through_nullness$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$().getMap();\n  return map.containsKey(key)\n         ? $name$ValueConverter.doForward(map.get(key))\n         : defaultValue;\n}\n"
    ;
    text_03._M_len = 0x1b6;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_03);
    begin_varname_03._M_str = "{";
    begin_varname_03._M_len = 1;
    end_varname_03._M_str = "}";
    end_varname_03._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_03,end_varname_03,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar1 = this->descriptor_;
    Options::Options(&local_170,&this->context_->options_);
    WriteFieldDocComment(printer,pFVar1,&local_170,false);
    Options::~Options(&local_170);
    text_04._M_str =
         "@java.lang.Override\n$deprecation$public $value_enum_type$ ${$get$capitalized_name$OrThrow$}$(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$().getMap();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return $name$ValueConverter.doForward(map.get(key));\n}\n"
    ;
    text_04._M_len = 0x183;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_04);
    begin_varname_04._M_str = "{";
    begin_varname_04._M_len = 1;
    end_varname_04._M_str = "}";
    end_varname_04._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_04,end_varname_04,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    bVar2 = SupportUnknownEnumValue(pFVar4);
    if (!bVar2) {
      return;
    }
    text_05._M_str =
         "/**\n * Use {@link #get$capitalized_name$ValueMap()} instead.\n */\n@java.lang.Override\n@java.lang.Deprecated\npublic java.util.Map<$boxed_key_type$, $boxed_value_type$>\n${$get$capitalized_name$Value$}$() {\n  return get$capitalized_name$ValueMap();\n}\n"
    ;
    text_05._M_len = 0xf7;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_05);
    begin_varname_05._M_str = "{";
    begin_varname_05._M_len = 1;
    end_varname_05._M_str = "}";
    end_varname_05._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_05,end_varname_05,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar4 = this->descriptor_;
    Options::Options(&local_1c0,&this->context_->options_);
    WriteFieldDocComment(printer,pFVar4,&local_1c0,false);
    Options::~Options(&local_1c0);
    text_06._M_str =
         "@java.lang.Override\n$deprecation$public java.util.Map<$boxed_key_type$, $boxed_value_type$>\n${$get$capitalized_name$ValueMap$}$() {\n  return internalGet$capitalized_name$().getMap();\n}\n"
    ;
    text_06._M_len = 0xb9;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_06);
    begin_varname_06._M_str = "{";
    begin_varname_06._M_len = 1;
    end_varname_06._M_str = "}";
    end_varname_06._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_06,end_varname_06,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar4 = this->descriptor_;
    Options::Options(&local_210,&this->context_->options_);
    WriteFieldDocComment(printer,pFVar4,&local_210,false);
    Options::~Options(&local_210);
    text_07._M_str =
         "@java.lang.Override\n$deprecation$public $value_type_pass_through_nullness$ ${$get$capitalized_name$ValueOrDefault$}$(\n    $key_type$ key,\n    $value_type_pass_through_nullness$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$().getMap();\n  return map.containsKey(key) ? map.get(key) : defaultValue;\n}\n"
    ;
    text_07._M_len = 0x17f;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_07);
    begin_varname_07._M_str = "{";
    begin_varname_07._M_len = 1;
    end_varname_07._M_str = "}";
    end_varname_07._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_07,end_varname_07,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar4 = this->descriptor_;
    Options::Options(&local_260,&this->context_->options_);
    WriteFieldDocComment(printer,pFVar4,&local_260,false);
    Options::~Options(&local_260);
    pcVar5 = 
    "@java.lang.Override\n$deprecation$public $value_type$ ${$get$capitalized_name$ValueOrThrow$}$(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$().getMap();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return map.get(key);\n}\n"
    ;
    sVar6 = 0x163;
  }
  else {
    if (bVar2 != false) {
      text_08._M_str =
           "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Override\n@java.lang.Deprecated\npublic java.util.Map<$type_parameters$> ${$get$capitalized_name$$}$() {\n  return get$capitalized_name$Map();\n}\n"
      ;
      text_08._M_len = 0xd5;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,vars,text_08);
      begin_varname_08._M_str = "{";
      begin_varname_08._M_len = 1;
      end_varname_08._M_str = "}";
      end_varname_08._M_len = 1;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,begin_varname_08,end_varname_08,this->descriptor_,
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
      pCVar7 = this->context_;
    }
    pFVar4 = this->descriptor_;
    Options::Options(&local_2b0,&pCVar7->options_);
    WriteFieldDocComment(printer,pFVar4,&local_2b0,false);
    Options::~Options(&local_2b0);
    text_09._M_str =
         "@java.lang.Override\n$deprecation$public java.util.Map<$type_parameters$> ${$get$capitalized_name$Map$}$() {\n  return internalGet$capitalized_name$().getMap();\n}\n"
    ;
    text_09._M_len = 0xa1;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_09);
    begin_varname_09._M_str = "{";
    begin_varname_09._M_len = 1;
    end_varname_09._M_str = "}";
    end_varname_09._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_09,end_varname_09,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar4 = this->descriptor_;
    Options::Options(&local_300,&this->context_->options_);
    WriteFieldDocComment(printer,pFVar4,&local_300,false);
    Options::~Options(&local_300);
    text_10._M_str =
         "@java.lang.Override\n$deprecation$public $value_type_pass_through_nullness$ ${$get$capitalized_name$OrDefault$}$(\n    $key_type$ key,\n    $value_type_pass_through_nullness$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$type_parameters$> map =\n      internalGet$capitalized_name$().getMap();\n  return map.containsKey(key) ? map.get(key) : defaultValue;\n}\n"
    ;
    text_10._M_len = 0x167;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_10);
    begin_varname_10._M_str = "{";
    begin_varname_10._M_len = 1;
    end_varname_10._M_str = "}";
    end_varname_10._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_10,end_varname_10,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar4 = this->descriptor_;
    Options::Options(&local_350,&this->context_->options_);
    WriteFieldDocComment(printer,pFVar4,&local_350,false);
    Options::~Options(&local_350);
    pcVar5 = 
    "@java.lang.Override\n$deprecation$public $value_type$ ${$get$capitalized_name$OrThrow$}$(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$type_parameters$> map =\n      internalGet$capitalized_name$().getMap();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return map.get(key);\n}\n"
    ;
    sVar6 = 0x14b;
  }
  text_11._M_str = pcVar5;
  text_11._M_len = sVar6;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_11);
  begin_varname_11._M_str = "{";
  begin_varname_11._M_len = 1;
  end_varname_11._M_str = "}";
  end_varname_11._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_11,end_varname_11,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateMapGetters(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return internalGet$capitalized_name$().getMap().size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public boolean ${$contains$capitalized_name$$}$(\n"
      "    $key_type$ key) {\n"
      "  $key_null_check$\n"
      "  return internalGet$capitalized_name$().getMap().containsKey(key);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  const FieldDescriptor* value = MapValueField(descriptor_);
  if (GetJavaType(value) == JAVATYPE_ENUM) {
    if (context_->options().opensource_runtime) {
      printer->Print(
          variables_,
          "/**\n"
          " * Use {@link #get$capitalized_name$Map()} instead.\n"
          " */\n"
          "@java.lang.Override\n"
          "@java.lang.Deprecated\n"
          "public java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
          "${$get$capitalized_name$$}$() {\n"
          "  return get$capitalized_name$Map();\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
    }

    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$public java.util.Map<$boxed_key_type$, "
                   "$value_enum_type$>\n"
                   "${$get$capitalized_name$Map$}$() {\n"
                   "  return internalGetAdapted$capitalized_name$Map(\n"
                   "      internalGet$capitalized_name$().getMap());"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);

    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public $value_enum_type_pass_through_nullness$ "
        "${$get$capitalized_name$OrDefault$}$(\n"
        "    $key_type$ key,\n"
        "    $value_enum_type_pass_through_nullness$ defaultValue) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
        "      internalGet$capitalized_name$().getMap();\n"
        "  return map.containsKey(key)\n"
        "         ? $name$ValueConverter.doForward(map.get(key))\n"
        "         : defaultValue;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);

    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public $value_enum_type$ "
        "${$get$capitalized_name$OrThrow$}$(\n"
        "    $key_type$ key) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
        "      internalGet$capitalized_name$().getMap();\n"
        "  if (!map.containsKey(key)) {\n"
        "    throw new java.lang.IllegalArgumentException();\n"
        "  }\n"
        "  return $name$ValueConverter.doForward(map.get(key));\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);

    if (SupportUnknownEnumValue(value)) {
      printer->Print(
          variables_,
          "/**\n"
          " * Use {@link #get$capitalized_name$ValueMap()} instead.\n"
          " */\n"
          "@java.lang.Override\n"
          "@java.lang.Deprecated\n"
          "public java.util.Map<$boxed_key_type$, $boxed_value_type$>\n"
          "${$get$capitalized_name$Value$}$() {\n"
          "  return get$capitalized_name$ValueMap();\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(variables_,
                     "@java.lang.Override\n"
                     "$deprecation$public java.util.Map<$boxed_key_type$, "
                     "$boxed_value_type$>\n"
                     "${$get$capitalized_name$ValueMap$}$() {\n"
                     "  return internalGet$capitalized_name$().getMap();\n"
                     "}\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(
          variables_,
          "@java.lang.Override\n"
          "$deprecation$public $value_type_pass_through_nullness$ "
          "${$get$capitalized_name$ValueOrDefault$}$(\n"
          "    $key_type$ key,\n"
          "    $value_type_pass_through_nullness$ defaultValue) {\n"
          "  $key_null_check$\n"
          "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
          "      internalGet$capitalized_name$().getMap();\n"
          "  return map.containsKey(key) ? map.get(key) : defaultValue;\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(
          variables_,
          "@java.lang.Override\n"
          "$deprecation$public $value_type$ "
          "${$get$capitalized_name$ValueOrThrow$}$(\n"
          "    $key_type$ key) {\n"
          "  $key_null_check$\n"
          "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
          "      internalGet$capitalized_name$().getMap();\n"
          "  if (!map.containsKey(key)) {\n"
          "    throw new java.lang.IllegalArgumentException();\n"
          "  }\n"
          "  return map.get(key);\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
    }
  } else {
    if (context_->options().opensource_runtime) {
      printer->Print(variables_,
                     "/**\n"
                     " * Use {@link #get$capitalized_name$Map()} instead.\n"
                     " */\n"
                     "@java.lang.Override\n"
                     "@java.lang.Deprecated\n"
                     "public java.util.Map<$type_parameters$> "
                     "${$get$capitalized_name$$}$() {\n"
                     "  return get$capitalized_name$Map();\n"
                     "}\n");
      printer->Annotate("{", "}", descriptor_);
    }
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$public java.util.Map<$type_parameters$> "
                   "${$get$capitalized_name$Map$}$() {\n"
                   "  return internalGet$capitalized_name$().getMap();\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public $value_type_pass_through_nullness$ "
        "${$get$capitalized_name$OrDefault$}$(\n"
        "    $key_type$ key,\n"
        "    $value_type_pass_through_nullness$ defaultValue) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$type_parameters$> map =\n"
        "      internalGet$capitalized_name$().getMap();\n"
        "  return map.containsKey(key) ? map.get(key) : defaultValue;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public $value_type$ ${$get$capitalized_name$OrThrow$}$(\n"
        "    $key_type$ key) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$type_parameters$> map =\n"
        "      internalGet$capitalized_name$().getMap();\n"
        "  if (!map.containsKey(key)) {\n"
        "    throw new java.lang.IllegalArgumentException();\n"
        "  }\n"
        "  return map.get(key);\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }
}